

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall asl::Console::bgcolor(Console *this,Color color)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = color - RED;
  if ((uVar1 < 8) && ((0xd7U >> (uVar1 & 0x1f) & 1) != 0)) {
    pcVar3 = &DAT_00141138 + *(int *)(&DAT_00141138 + (ulong)uVar1 * 4);
  }
  else {
    pcVar2 = "49";
    if (color == WHITE) {
      pcVar2 = "47";
    }
    pcVar3 = "46";
    if (color != CYAN) {
      pcVar3 = pcVar2;
    }
  }
  printf("\x1b[%sm",pcVar3);
  this->_colorChanged = true;
  return;
}

Assistant:

void Console::bgcolor(Color color)
{
	const char* attr =
		color==BLACK? "40":
		color==RED? "41":
		color==GREEN? "42":
		color==YELLOW? "43":
		color==BLUE? "44":
		color==MAGENTA? "45":
		color==CYAN? "46":
		color==WHITE? "47":
		"49";
	printf("\033[%sm", attr);
	_colorChanged = true;
}